

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_gates.cpp
# Opt level: O3

void lsim::sim_register_gate_functions(Simulator *sim)

{
  _Any_data local_128;
  code *local_118;
  code *local_110;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:12:5)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:12:5)>
             ::_M_manager;
  Simulator::register_sim_function(sim,0x11,1,(simulation_func_t *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:19:5)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:19:5)>
             ::_M_manager;
  Simulator::register_sim_function(sim,0x12,1,(simulation_func_t *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:32:5)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:32:5)>
             ::_M_manager;
  Simulator::register_sim_function(sim,0x13,1,(simulation_func_t *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:42:5)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:42:5)>
             ::_M_manager;
  Simulator::register_sim_function(sim,0x14,1,(simulation_func_t *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:52:5)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:52:5)>
             ::_M_manager;
  Simulator::register_sim_function(sim,0x15,1,(simulation_func_t *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:58:5)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:58:5)>
             ::_M_manager;
  Simulator::register_sim_function(sim,0x16,1,(simulation_func_t *)&local_c8);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d0 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:68:5)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:68:5)>
             ::_M_manager;
  Simulator::register_sim_function(sim,0x17,1,(simulation_func_t *)&local_e8);
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  local_f0 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:78:5)>
             ::_M_invoke;
  local_f8 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:78:5)>
             ::_M_manager;
  Simulator::register_sim_function(sim,0x18,1,(simulation_func_t *)&local_108);
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,__destroy_functor);
  }
  local_128._M_unused._M_object = (void *)0x0;
  local_128._8_8_ = 0;
  local_110 = std::
              _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:86:5)>
              ::_M_invoke;
  local_118 = std::
              _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_gates.cpp:86:5)>
              ::_M_manager;
  Simulator::register_sim_function(sim,0x19,1,(simulation_func_t *)&local_128);
  if (local_118 != (code *)0x0) {
    (*local_118)(&local_128,&local_128,__destroy_functor);
  }
  return;
}

Assistant:

void sim_register_gate_functions(Simulator *sim) {

    SIM_INPUT_CHANGED_FUNC_BEGIN(BUFFER) {
        for (auto pin = 0u; pin < comp->num_inputs(); ++pin) {
            auto value = comp->read_pin(comp->input_pin_index(pin));
            comp->write_pin(comp->output_pin_index(pin), value);
        }
    } SIM_FUNC_END

    SIM_INPUT_CHANGED_FUNC_BEGIN(TRISTATE_BUFFER) {
         if (comp->read_pin(comp->control_pin_index(0)) != VALUE_TRUE) {
            for (auto pin = 0u; pin < comp->num_outputs(); ++pin) {
                comp->write_pin(comp->output_pin_index(pin), VALUE_UNDEFINED);
            }
        } else {
            for (auto pin = 0u; pin < comp->num_inputs(); ++pin) {
                auto value = comp->read_pin(comp->input_pin_index(pin));
                comp->write_pin(comp->output_pin_index(pin), value);
            }
        }
    } SIM_FUNC_END

    SIM_INPUT_CHANGED_FUNC_BEGIN(AND_GATE) {
        comp->reset_bad_read_check();

        bool output = comp->read_pin_checked(0);
        for (auto idx = 1u; idx < comp->num_inputs(); ++idx) {
            output &= comp->read_pin_checked(idx);
        }
        comp->write_pin_checked(comp->output_pin_index(0), output);
    } SIM_FUNC_END

    SIM_INPUT_CHANGED_FUNC_BEGIN(OR_GATE) {
        comp->reset_bad_read_check();

        bool output = comp->read_pin_checked(0);
        for (auto idx = 1u; idx < comp->num_inputs(); ++idx) {
            output |= comp->read_pin_checked(idx);
        }
        comp->write_pin_checked(comp->output_pin_index(0), output);
    } SIM_FUNC_END

    SIM_INPUT_CHANGED_FUNC_BEGIN(NOT_GATE) {
        comp->reset_bad_read_check();
        auto input = comp->read_pin_checked(0);
        comp->write_pin_checked(1, !input);
    } SIM_FUNC_END

    SIM_INPUT_CHANGED_FUNC_BEGIN(NAND_GATE) {
        comp->reset_bad_read_check();

        bool output = comp->read_pin_checked(0);
        for (auto idx = 1u; idx < comp->num_inputs(); ++idx) {
            output &= comp->read_pin_checked(idx);
        }
        comp->write_pin_checked(comp->output_pin_index(0), !output);
    } SIM_FUNC_END

    SIM_INPUT_CHANGED_FUNC_BEGIN(NOR_GATE) {
        comp->reset_bad_read_check();

        bool output = comp->read_pin_checked(0);
        for (auto idx = 1u; idx < comp->num_inputs(); ++idx) {
            output |= comp->read_pin_checked(idx);
        }
        comp->write_pin_checked(comp->output_pin_index(0), !output);
    } SIM_FUNC_END

    SIM_INPUT_CHANGED_FUNC_BEGIN(XOR_GATE) {
        comp->reset_bad_read_check();

        auto output = comp->read_pin_checked(0);
        output ^= static_cast<int>(comp->read_pin_checked(1));
        comp->write_pin_checked(2, output);
    } SIM_FUNC_END

    SIM_INPUT_CHANGED_FUNC_BEGIN(XNOR_GATE) {
        comp->reset_bad_read_check();

        auto output = comp->read_pin_checked(0);
        output ^= static_cast<int>(comp->read_pin_checked(1));
        comp->write_pin_checked(2, !output);
    } SIM_FUNC_END
}